

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_is_model_animation_valid(rf_model model,rf_model_animation anim)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (model.bone_count != anim.bone_count) {
    return false;
  }
  lVar3 = 0;
  if (0 < model.bone_count) {
    lVar3 = model.bone_count;
  }
  lVar3 = lVar3 + 1;
  lVar4 = 0x20;
  do {
    lVar3 = lVar3 + -1;
    bVar5 = lVar3 == 0;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = (model.bones)->name + lVar4;
    pcVar2 = (anim.bones)->name + lVar4;
    lVar4 = lVar4 + 0x28;
  } while (*(long *)pcVar1 == *(long *)pcVar2);
  return bVar5;
}

Assistant:

RF_API bool rf_is_model_animation_valid(rf_model model, rf_model_animation anim)
{
    int result = true;

    if (model.bone_count != anim.bone_count) result = false;
    else
    {
        for (rf_int i = 0; i < model.bone_count; i++)
        {
            if (model.bones[i].parent != anim.bones[i].parent) { result = false; break; }
        }
    }

    return result;
}